

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pIVar4;
  pointer pGVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21c;
  undefined1 local_21b;
  allocator local_21a;
  allocator local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  iterator local_1d0;
  size_type local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  Enum local_1a4;
  Var local_1a0;
  unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> local_158;
  unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> action_1;
  int local_fc;
  Var local_e8;
  unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> local_a0;
  unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> action;
  undefined1 local_48 [8];
  Location loc;
  ActionPtr *out_action_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    TVar2 = Peek(this,0);
    if (TVar2 == Get) {
      Consume((Token *)&action_1,this);
      Token::~Token((Token *)&action_1);
      MakeUnique<wabt::GetAction,wabt::Location&>((wabt *)&local_158,(Location *)local_48);
      pGVar5 = std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::operator->
                         (&local_158);
      Var::Var(&local_1a0,this->last_module_index_,(Location *)local_48);
      ParseVarOpt(this,&(pGVar5->super_ActionMixin<(wabt::ActionType)1>).super_Action.module_var,
                  &local_1a0);
      Var::~Var(&local_1a0);
      pGVar5 = std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::operator->
                         (&local_158);
      local_1a4 = (Enum)ParseQuotedText(this,&(pGVar5->super_ActionMixin<(wabt::ActionType)1>).
                                              super_Action.name);
      bVar1 = Failed((Result)local_1a4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_fc = 1;
      }
      else {
        std::unique_ptr<wabt::Action,std::default_delete<wabt::Action>>::operator=
                  ((unique_ptr<wabt::Action,std::default_delete<wabt::Action>> *)out_action,
                   &local_158);
        local_fc = 4;
      }
      std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::~unique_ptr
                (&local_158);
    }
    else {
      if (TVar2 != Invoke) {
        local_21b = 1;
        local_218 = &local_210;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,"invoke",&local_219);
        local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"get",&local_21a);
        local_21b = 0;
        local_1d0 = &local_210;
        local_1c8 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_21c);
        __l._M_len = local_1c8;
        __l._M_array = local_1d0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,__l,&local_21c);
        this_local._4_4_ = ErrorExpected(this,&local_1c0,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_21c);
        local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
        do {
          local_2c0 = local_2c0 + -1;
          std::__cxx11::string::~string((string *)local_2c0);
        } while (local_2c0 != &local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_21a);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        return (Result)this_local._4_4_;
      }
      Consume((Token *)&action,this);
      Token::~Token((Token *)&action);
      MakeUnique<wabt::InvokeAction,wabt::Location&>((wabt *)&local_a0,(Location *)local_48);
      pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
               operator->(&local_a0);
      Var::Var(&local_e8,this->last_module_index_,(Location *)local_48);
      ParseVarOpt(this,&(pIVar4->super_ActionMixin<(wabt::ActionType)0>).super_Action.module_var,
                  &local_e8);
      Var::~Var(&local_e8);
      pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
               operator->(&local_a0);
      RVar3 = ParseQuotedText(this,&(pIVar4->super_ActionMixin<(wabt::ActionType)0>).super_Action.
                                    name);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_fc = 1;
      }
      else {
        pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
                 operator->(&local_a0);
        RVar3 = ParseConstList(this,&pIVar4->args);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_fc = 1;
        }
        else {
          std::unique_ptr<wabt::Action,std::default_delete<wabt::Action>>::operator=
                    ((unique_ptr<wabt::Action,std::default_delete<wabt::Action>> *)out_action,
                     &local_a0);
          local_fc = 4;
        }
      }
      std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::~unique_ptr
                (&local_a0);
    }
    if (local_fc != 1) {
      RVar3 = Expect(this,Rpar);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = MakeUnique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = MakeUnique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}